

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

FlatView * generate_memory_topology(uc_struct_conflict15 *uc,MemoryRegion_conflict *mr)

{
  undefined1 start [16];
  undefined1 base [16];
  undefined1 size [16];
  AddrRange clip;
  MemoryRegion_conflict *mr_00;
  FlatView *view_00;
  Int128 *pIVar1;
  Int128 *pIVar2;
  AddressSpaceDispatch *pAVar3;
  undefined8 extraout_RDX;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 uVar4;
  undefined1 local_e8 [8];
  MemoryRegionSection mrs;
  AddrRange local_58;
  Int128 *local_38;
  FlatView *local_28;
  FlatView *view;
  MemoryRegion_conflict *pMStack_18;
  int i;
  MemoryRegion_conflict *mr_local;
  uc_struct_conflict15 *uc_local;
  
  pMStack_18 = mr;
  mr_local = (MemoryRegion_conflict *)uc;
  view_00 = flatview_new(mr);
  mr_00 = pMStack_18;
  local_28 = view_00;
  if (pMStack_18 != (MemoryRegion_conflict *)0x0) {
    pIVar1 = int128_zero();
    local_38 = pIVar1;
    pIVar2 = int128_zero();
    uVar4 = extraout_RDX;
    int128_2_64();
    start._8_8_ = in_stack_fffffffffffffed0;
    start._0_8_ = in_stack_fffffffffffffec8;
    size._8_8_ = in_stack_fffffffffffffee0;
    size._0_8_ = in_stack_fffffffffffffed8;
    addrrange_make(&local_58,(Int128)start,(Int128)size);
    base._8_8_ = local_58.start._8_8_;
    base._0_8_ = (undefined8)local_58.start;
    clip.start._8_8_ = local_58.size._8_8_;
    clip.start._0_8_ = (undefined8)local_58.size;
    clip.size._0_8_ = uVar4;
    clip.size._8_8_ = pIVar2;
    mrs._56_8_ = pIVar1;
    render_memory_region(view_00,mr_00,(Int128)base,clip,SUB81(pIVar1,0));
  }
  flatview_simplify(local_28);
  pAVar3 = address_space_dispatch_new_tricore((uc_struct_conflict15 *)mr_local,local_28);
  local_28->dispatch = pAVar3;
  for (view._4_4_ = 0; view._4_4_ < local_28->nr; view._4_4_ = view._4_4_ + 1) {
    section_from_flat_range
              ((MemoryRegionSection *)local_e8,local_28->ranges + (int)view._4_4_,local_28);
    flatview_add_to_dispatch_tricore
              ((uc_struct_conflict15 *)mr_local,local_28,(MemoryRegionSection *)local_e8);
  }
  address_space_dispatch_compact_tricore(local_28->dispatch);
  g_hash_table_replace((GHashTable *)mr_local[4].end,pMStack_18,local_28);
  return local_28;
}

Assistant:

static FlatView *generate_memory_topology(struct uc_struct *uc, MemoryRegion *mr)
{
    int i;
    FlatView *view;

    view = flatview_new(mr);

    if (mr) {
        render_memory_region(view, mr, int128_zero(),
                             addrrange_make(int128_zero(), int128_2_64()),
                             false);
    }
    flatview_simplify(view);

    view->dispatch = address_space_dispatch_new(uc, view);
    for (i = 0; i < view->nr; i++) {
        MemoryRegionSection mrs =
            section_from_flat_range(&view->ranges[i], view);
        flatview_add_to_dispatch(uc, view, &mrs);
    }
    address_space_dispatch_compact(view->dispatch);
    g_hash_table_replace(uc->flat_views, mr, view);

    return view;
}